

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_slow.cc
# Opt level: O0

void absl::lts_20240722::random_internal::RandenSlow::Generate(void *keys_void,void *state_void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ulong uVar36;
  ulong uVar37;
  uint128 other;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong *puVar42;
  undefined8 *puVar43;
  undefined8 *puVar44;
  uint128 prev_inner;
  uint128 *keys;
  uint128 *state;
  void *state_void_local;
  void *keys_void_local;
  ulong local_3c0;
  size_t round;
  Vector128 o3;
  uint local_390;
  uint uStack_38c;
  byte bStack_387;
  byte bStack_386;
  byte bStack_385;
  byte bStack_384;
  byte bStack_383;
  byte bStack_382;
  byte bStack_381;
  Vector128 f2;
  Vector128 s3;
  Vector128 s2;
  Vector128 o1;
  uint local_340;
  uint uStack_33c;
  byte bStack_337;
  byte bStack_336;
  byte bStack_335;
  byte bStack_334;
  byte bStack_333;
  byte bStack_332;
  byte bStack_331;
  Vector128 f0;
  Vector128 s1;
  Vector128 s0;
  ulong local_300;
  size_t branch;
  uint128 w7;
  uint128 w6;
  uint128 w5;
  uint128 w4;
  uint128 w3;
  uint128 w2;
  uint128 w1;
  uint128 w0;
  uint128 v7;
  uint128 v6;
  uint128 v5;
  uint128 v4;
  uint128 v3;
  uint128 v2;
  uint128 v1;
  uint128 v0;
  size_t shuffle [16];
  Vector128 result_7;
  Vector128 result_6;
  Vector128 result_5;
  Vector128 result_2;
  Vector128 result_1;
  Vector128 result;
  Vector128 result_9;
  Vector128 result_8;
  Vector128 result_4;
  Vector128 result_3;
  
  other = *state_void;
  round = (size_t)keys_void;
  for (local_3c0 = 0; local_3c0 < 0x11; local_3c0 = local_3c0 + 1) {
    branch = round;
    for (local_300 = 0; local_300 < 0x10; local_300 = local_300 + 4) {
      puVar42 = (ulong *)((long)state_void + local_300 * 0x10);
      uVar36 = *puVar42;
      uVar37 = puVar42[1];
      puVar43 = (undefined8 *)((long)state_void + local_300 * 0x10 + 0x10);
      uVar6 = *puVar43;
      uVar7 = puVar43[1];
      o1.s[2] = (uint32_t)*(undefined8 *)branch;
      uVar38 = o1.s[2] ^ *(uint *)((anonymous_namespace)::te0 + (uVar36 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar36 >> 0x28 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar37 >> 0x10 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar37 >> 0x38) * 4);
      o1.s[3] = (uint32_t)((ulong)*(undefined8 *)branch >> 0x20);
      uVar39 = o1.s[3] ^ *(uint *)((anonymous_namespace)::te0 + (uVar36 >> 0x20 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar37 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar37 >> 0x30 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar36 >> 0x18 & 0xff) * 4);
      local_340 = (uint)*(undefined8 *)(branch + 8);
      uVar40 = local_340 ^ *(uint *)((anonymous_namespace)::te0 + (uVar37 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar37 >> 0x28 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar36 >> 0x10 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar36 >> 0x38) * 4);
      uStack_33c = (uint)((ulong)*(undefined8 *)(branch + 8) >> 0x20);
      uVar41 = uStack_33c ^ *(uint *)((anonymous_namespace)::te0 + (uVar37 >> 0x20 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar36 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar36 >> 0x30 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar37 >> 0x18 & 0xff) * 4);
      f0.s[2] = (uint32_t)uVar6;
      bStack_333 = (byte)(uVar39 >> 8);
      f0.s[0]._2_1_ = (byte)(uVar40 >> 0x10);
      f0.s[1]._3_1_ = (byte)(uVar41 >> 0x18);
      f0.s[3] = (uint32_t)((ulong)uVar6 >> 0x20);
      bStack_334 = (byte)uVar39;
      f0.s[0]._1_1_ = (byte)(uVar40 >> 8);
      f0.s[1]._2_1_ = (byte)(uVar41 >> 0x10);
      bStack_335 = (byte)(uVar38 >> 0x18);
      s1.s[0] = (uint32_t)uVar7;
      uVar1 = *(uint *)((anonymous_namespace)::te0 + ((ulong)uVar40 & 0xff) * 4);
      f0.s[1]._1_1_ = (byte)(uVar41 >> 8);
      uVar2 = *(uint *)((anonymous_namespace)::te1 + (ulong)f0.s[1]._1_1_ * 4);
      bStack_336 = (byte)(uVar38 >> 0x10);
      uVar3 = *(uint *)((anonymous_namespace)::te2 + (ulong)bStack_336 * 4);
      bStack_331 = (byte)(uVar39 >> 0x18);
      uVar4 = *(uint *)((anonymous_namespace)::te3 + (ulong)bStack_331 * 4);
      s1.s[1] = (uint32_t)((ulong)uVar7 >> 0x20);
      f0.s[1]._0_1_ = (byte)uVar41;
      uVar41 = *(uint *)((anonymous_namespace)::te0 + (ulong)(byte)f0.s[1] * 4);
      bStack_337 = (byte)(uVar38 >> 8);
      uVar5 = *(uint *)((anonymous_namespace)::te1 + (ulong)bStack_337 * 4);
      bStack_332 = (byte)(uVar39 >> 0x10);
      uVar39 = *(uint *)((anonymous_namespace)::te2 + (ulong)bStack_332 * 4);
      f0.s[0]._3_1_ = (byte)(uVar40 >> 0x18);
      uVar40 = *(uint *)((anonymous_namespace)::te3 + (ulong)f0.s[0]._3_1_ * 4);
      puVar43 = (undefined8 *)((long)state_void + local_300 * 0x10 + 0x10);
      *puVar43 = CONCAT44(f0.s[3] ^ *(uint *)((anonymous_namespace)::te0 + (ulong)bStack_334 * 4) ^
                          *(uint *)((anonymous_namespace)::te1 + (ulong)f0.s[0]._1_1_ * 4) ^
                          *(uint *)((anonymous_namespace)::te2 + (ulong)f0.s[1]._2_1_ * 4) ^
                          *(uint *)((anonymous_namespace)::te3 + (ulong)bStack_335 * 4),
                          f0.s[2] ^ *(uint *)((anonymous_namespace)::te0 +
                                             ((ulong)uVar38 & 0xff) * 4) ^
                          *(uint *)((anonymous_namespace)::te1 + (ulong)bStack_333 * 4) ^
                          *(uint *)((anonymous_namespace)::te2 + (ulong)f0.s[0]._2_1_ * 4) ^
                          *(uint *)((anonymous_namespace)::te3 + (ulong)f0.s[1]._3_1_ * 4));
      puVar43[1] = CONCAT44(s1.s[1] ^ uVar41 ^ uVar5 ^ uVar39 ^ uVar40,
                            s1.s[0] ^ uVar1 ^ uVar2 ^ uVar3 ^ uVar4);
      puVar42 = (ulong *)((long)state_void + local_300 * 0x10 + 0x20);
      uVar36 = *puVar42;
      uVar37 = puVar42[1];
      puVar43 = (undefined8 *)((long)state_void + local_300 * 0x10 + 0x30);
      uVar6 = *puVar43;
      uVar7 = puVar43[1];
      o3.s[2] = (uint32_t)*(undefined8 *)(branch + 0x10);
      uVar38 = o3.s[2] ^ *(uint *)((anonymous_namespace)::te0 + (uVar36 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar36 >> 0x28 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar37 >> 0x10 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar37 >> 0x38) * 4);
      o3.s[3] = (uint32_t)((ulong)*(undefined8 *)(branch + 0x10) >> 0x20);
      uVar39 = o3.s[3] ^ *(uint *)((anonymous_namespace)::te0 + (uVar36 >> 0x20 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar37 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar37 >> 0x30 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar36 >> 0x18 & 0xff) * 4);
      local_390 = (uint)*(undefined8 *)(branch + 0x18);
      uVar40 = local_390 ^ *(uint *)((anonymous_namespace)::te0 + (uVar37 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar37 >> 0x28 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar36 >> 0x10 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar36 >> 0x38) * 4);
      uStack_38c = (uint)((ulong)*(undefined8 *)(branch + 0x18) >> 0x20);
      uVar41 = uStack_38c ^ *(uint *)((anonymous_namespace)::te0 + (uVar37 >> 0x20 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (uVar36 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (uVar36 >> 0x30 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar37 >> 0x18 & 0xff) * 4);
      branch = branch + 0x20;
      f2.s[2] = (uint32_t)uVar6;
      bStack_383 = (byte)(uVar39 >> 8);
      f2.s[0]._2_1_ = (byte)(uVar40 >> 0x10);
      f2.s[1]._3_1_ = (byte)(uVar41 >> 0x18);
      f2.s[3] = (uint32_t)((ulong)uVar6 >> 0x20);
      bStack_384 = (byte)uVar39;
      f2.s[0]._1_1_ = (byte)(uVar40 >> 8);
      f2.s[1]._2_1_ = (byte)(uVar41 >> 0x10);
      bStack_385 = (byte)(uVar38 >> 0x18);
      s3.s[0] = (uint32_t)uVar7;
      uVar1 = *(uint *)((anonymous_namespace)::te0 + ((ulong)uVar40 & 0xff) * 4);
      f2.s[1]._1_1_ = (byte)(uVar41 >> 8);
      uVar2 = *(uint *)((anonymous_namespace)::te1 + (ulong)f2.s[1]._1_1_ * 4);
      bStack_386 = (byte)(uVar38 >> 0x10);
      uVar3 = *(uint *)((anonymous_namespace)::te2 + (ulong)bStack_386 * 4);
      bStack_381 = (byte)(uVar39 >> 0x18);
      uVar4 = *(uint *)((anonymous_namespace)::te3 + (ulong)bStack_381 * 4);
      s3.s[1] = (uint32_t)((ulong)uVar7 >> 0x20);
      f2.s[1]._0_1_ = (byte)uVar41;
      uVar41 = *(uint *)((anonymous_namespace)::te0 + (ulong)(byte)f2.s[1] * 4);
      bStack_387 = (byte)(uVar38 >> 8);
      uVar5 = *(uint *)((anonymous_namespace)::te1 + (ulong)bStack_387 * 4);
      bStack_382 = (byte)(uVar39 >> 0x10);
      uVar39 = *(uint *)((anonymous_namespace)::te2 + (ulong)bStack_382 * 4);
      f2.s[0]._3_1_ = (byte)(uVar40 >> 0x18);
      uVar40 = *(uint *)((anonymous_namespace)::te3 + (ulong)f2.s[0]._3_1_ * 4);
      *(ulong *)((long)state_void + local_300 * 0x10 + 0x30) =
           CONCAT44(f2.s[3] ^ *(uint *)((anonymous_namespace)::te0 + (ulong)bStack_384 * 4) ^
                    *(uint *)((anonymous_namespace)::te1 + (ulong)f2.s[0]._1_1_ * 4) ^
                    *(uint *)((anonymous_namespace)::te2 + (ulong)f2.s[1]._2_1_ * 4) ^
                    *(uint *)((anonymous_namespace)::te3 + (ulong)bStack_385 * 4),
                    f2.s[2] ^ *(uint *)((anonymous_namespace)::te0 + ((ulong)uVar38 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te1 + (ulong)bStack_383 * 4) ^
                    *(uint *)((anonymous_namespace)::te2 + (ulong)f2.s[0]._2_1_ * 4) ^
                    *(uint *)((anonymous_namespace)::te3 + (ulong)f2.s[1]._3_1_ * 4));
      *(ulong *)((long)state_void + local_300 * 0x10 + 0x38) =
           CONCAT44(s3.s[1] ^ uVar41 ^ uVar5 ^ uVar39 ^ uVar40,
                    s3.s[0] ^ uVar1 ^ uVar2 ^ uVar3 ^ uVar4);
    }
    round = branch;
    memcpy(&v0.hi_,&DAT_00104000,0x80);
    puVar43 = (undefined8 *)((long)state_void + v0.hi_ * 0x10);
    v0.lo_ = puVar43[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[0] * 0x10);
    uVar6 = *puVar44;
    uVar7 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[1] * 0x10);
    uVar8 = *puVar44;
    uVar9 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[2] * 0x10);
    uVar10 = *puVar44;
    uVar11 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[3] * 0x10);
    uVar12 = *puVar44;
    uVar13 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[4] * 0x10);
    uVar14 = *puVar44;
    uVar15 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[5] * 0x10);
    uVar16 = *puVar44;
    uVar17 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[6] * 0x10);
    uVar18 = *puVar44;
    uVar19 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[7] * 0x10);
    uVar20 = *puVar44;
    uVar21 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[8] * 0x10);
    uVar22 = *puVar44;
    uVar23 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[9] * 0x10);
    uVar24 = *puVar44;
    uVar25 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[10] * 0x10);
    uVar26 = *puVar44;
    uVar27 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[0xb] * 0x10);
    uVar28 = *puVar44;
    uVar29 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[0xc] * 0x10);
    uVar30 = *puVar44;
    uVar31 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[0xd] * 0x10);
    uVar32 = *puVar44;
    uVar33 = puVar44[1];
    puVar44 = (undefined8 *)((long)state_void + shuffle[0xe] * 0x10);
    uVar34 = *puVar44;
    uVar35 = puVar44[1];
    *(undefined8 *)state_void = *puVar43;
    *(uint64_t *)((long)state_void + 8) = v0.lo_;
    *(undefined8 *)((long)state_void + 0x10) = uVar6;
    *(undefined8 *)((long)state_void + 0x18) = uVar7;
    *(undefined8 *)((long)state_void + 0x20) = uVar8;
    *(undefined8 *)((long)state_void + 0x28) = uVar9;
    *(undefined8 *)((long)state_void + 0x30) = uVar10;
    *(undefined8 *)((long)state_void + 0x38) = uVar11;
    *(undefined8 *)((long)state_void + 0x40) = uVar12;
    *(undefined8 *)((long)state_void + 0x48) = uVar13;
    *(undefined8 *)((long)state_void + 0x50) = uVar14;
    *(undefined8 *)((long)state_void + 0x58) = uVar15;
    *(undefined8 *)((long)state_void + 0x60) = uVar16;
    *(undefined8 *)((long)state_void + 0x68) = uVar17;
    *(undefined8 *)((long)state_void + 0x70) = uVar18;
    *(undefined8 *)((long)state_void + 0x78) = uVar19;
    *(undefined8 *)((long)state_void + 0x80) = uVar20;
    *(undefined8 *)((long)state_void + 0x88) = uVar21;
    *(undefined8 *)((long)state_void + 0x90) = uVar22;
    *(undefined8 *)((long)state_void + 0x98) = uVar23;
    *(undefined8 *)((long)state_void + 0xa0) = uVar24;
    *(undefined8 *)((long)state_void + 0xa8) = uVar25;
    *(undefined8 *)((long)state_void + 0xb0) = uVar26;
    *(undefined8 *)((long)state_void + 0xb8) = uVar27;
    *(undefined8 *)((long)state_void + 0xc0) = uVar28;
    *(undefined8 *)((long)state_void + 200) = uVar29;
    *(undefined8 *)((long)state_void + 0xd0) = uVar30;
    *(undefined8 *)((long)state_void + 0xd8) = uVar31;
    *(undefined8 *)((long)state_void + 0xe0) = uVar32;
    *(undefined8 *)((long)state_void + 0xe8) = uVar33;
    *(undefined8 *)((long)state_void + 0xf0) = uVar34;
    *(undefined8 *)((long)state_void + 0xf8) = uVar35;
  }
  uint128::operator^=((uint128 *)state_void,other);
  return;
}

Assistant:

void RandenSlow::Generate(const void* keys_void, void* state_void) {
  static_assert(RandenTraits::kCapacityBytes == sizeof(absl::uint128),
                "Capacity mismatch");

  auto* state = reinterpret_cast<absl::uint128*>(state_void);
  const auto* keys = reinterpret_cast<const absl::uint128*>(keys_void);

  const absl::uint128 prev_inner = state[0];

  SwapEndian(state);

  Permute(state, keys);

  SwapEndian(state);

  // Ensure backtracking resistance.
  *state ^= prev_inner;
}